

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.h
# Opt level: O0

uint64_t rapidjson::internal::BigInteger::ParseUint64(char *begin,char *end)

{
  bool bVar1;
  char *local_28;
  char *p;
  uint64_t r;
  char *end_local;
  char *begin_local;
  
  p = (char *)0x0;
  local_28 = begin;
  while( true ) {
    if (local_28 == end) {
      return (uint64_t)p;
    }
    bVar1 = false;
    if ('/' < *local_28) {
      bVar1 = *local_28 < ':';
    }
    if (!bVar1) break;
    p = (char *)((long)p * 10 + (ulong)((int)*local_28 - 0x30));
    local_28 = local_28 + 1;
  }
  __assert_fail("*p >= \'0\' && *p <= \'9\'",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/internal/biginteger.h"
                ,0xf2,
                "static uint64_t rapidjson::internal::BigInteger::ParseUint64(const char *, const char *)"
               );
}

Assistant:

static uint64_t ParseUint64(const char* begin, const char* end) {
        uint64_t r = 0;
        for (const char* p = begin; p != end; ++p) {
            RAPIDJSON_ASSERT(*p >= '0' && *p <= '9');
            r = r * 10u + static_cast<unsigned>(*p - '0');
        }
        return r;
    }